

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::CleanUpInlineCaches<false>(FunctionBody *this)

{
  InlineCache *this_00;
  IsInstInlineCache *this_01;
  FunctionCodeGenRuntimeData *pFVar1;
  bool bVar2;
  ushort uVar3;
  uint32 uVar4;
  PropertyId PVar5;
  uint uVar6;
  uint32 uVar7;
  RootObjectBase *this_02;
  void *pvVar8;
  FunctionBodyPolymorphicInlineCache *this_03;
  ulong uVar9;
  CacheAllocator *this_04;
  uint uVar10;
  InlineCacheAllocator *this_05;
  int iVar11;
  uint uVar12;
  IsInstInlineCache *inlineCache;
  ulong uVar13;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  FunctionCodeGenRuntimeData *local_50;
  Type runtimeData;
  uint local_34;
  
  local_34 = 0;
  if ((this->inlineCaches).ptr != (void **)0x0) {
    runtimeData.ptr._4_4_ = GetCountField(this,RootObjectLoadInlineCacheStart);
    uVar9 = (ulong)runtimeData.ptr._4_4_;
    if (runtimeData.ptr._4_4_ == 0) {
      uVar10 = 0;
    }
    else {
      uVar13 = 0;
      uVar10 = 0;
      do {
        this_00 = (InlineCache *)(this->inlineCaches).ptr[uVar13];
        if (this_00 != (InlineCache *)0x0) {
          bVar2 = InlineCache::RemoveFromInvalidationList(this_00);
          uVar10 = uVar10 + bVar2;
          this_05 = &((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     inlineCacheAllocator;
          Memory::InlineCacheAllocator::Unlock(this_05);
          Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::Free
                    (&this_05->
                      super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                     ,this_00,0x20);
        }
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    local_34 = uVar10;
    this_02 = GetRootObject(this);
    uVar4 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
    iVar11 = uVar4 - runtimeData.ptr._4_4_;
    uVar12 = runtimeData.ptr._4_4_;
    if (runtimeData.ptr._4_4_ <= uVar4 && iVar11 != 0) {
      do {
        if ((this->inlineCaches).ptr[uVar9] != (void *)0x0) {
          PVar5 = GetPropertyIdFromCacheId(this,(uint)uVar9);
          uVar6 = RootObjectBase::ReleaseInlineCache(this_02,PVar5,false,false,false);
          uVar10 = uVar10 + uVar6;
        }
        uVar9 = uVar9 + 1;
        iVar11 = iVar11 + -1;
        uVar12 = uVar4;
      } while (iVar11 != 0);
    }
    uVar4 = GetCountField(this,RootObjectStoreInlineCacheStart);
    iVar11 = uVar4 - uVar12;
    if (uVar12 <= uVar4 && iVar11 != 0) {
      uVar9 = (ulong)uVar12;
      do {
        if ((this->inlineCaches).ptr[uVar9] != (void *)0x0) {
          PVar5 = GetPropertyIdFromCacheId(this,(uint)uVar9);
          uVar6 = RootObjectBase::ReleaseInlineCache(this_02,PVar5,true,false,false);
          uVar10 = uVar10 + uVar6;
        }
        uVar9 = uVar9 + 1;
        iVar11 = iVar11 + -1;
        uVar12 = uVar4;
      } while (iVar11 != 0);
    }
    uVar4 = GetCountField(this,InlineCacheCount);
    iVar11 = uVar4 - uVar12;
    if (uVar12 <= uVar4 && iVar11 != 0) {
      uVar9 = (ulong)uVar12;
      do {
        if ((this->inlineCaches).ptr[uVar9] != (void *)0x0) {
          PVar5 = GetPropertyIdFromCacheId(this,(uint)uVar9);
          uVar6 = RootObjectBase::ReleaseInlineCache(this_02,PVar5,false,true,false);
          uVar10 = uVar10 + uVar6;
        }
        uVar9 = uVar9 + 1;
        iVar11 = iVar11 + -1;
        uVar12 = uVar4;
      } while (iVar11 != 0);
    }
    local_34 = uVar10;
    uVar4 = GetCountField(this,InlineCacheCount);
    uVar7 = GetCountField(this,IsInstInlineCacheCount);
    if (uVar12 < uVar7 + uVar4) {
      uVar9 = (ulong)uVar12;
      iVar11 = (uVar7 + uVar4) - uVar12;
      do {
        this_01 = (IsInstInlineCache *)(this->inlineCaches).ptr[uVar9];
        if (this_01 != (IsInstInlineCache *)0x0) {
          IsInstInlineCache::Unregister
                    (this_01,(this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext
                    );
          this_04 = &((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     isInstInlineCacheAllocator;
          Memory::CacheAllocator::Unlock(this_04);
          Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::Free
                    (&this_04->
                      super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>,
                     this_01,0x20);
        }
        uVar9 = uVar9 + 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    (this->inlineCaches).ptr = (void **)0x0;
  }
  pvVar8 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenRuntimeData);
  if ((pvVar8 != (void *)0x0) && (uVar3 = this->profiledCallSiteCount, uVar3 != 0)) {
    uVar9 = 0;
    do {
      pFVar1 = *(FunctionCodeGenRuntimeData **)((long)pvVar8 + uVar9 * 8);
      if (pFVar1 != (FunctionCodeGenRuntimeData *)0x0) {
        fn.this = this;
        fn.unregisteredInlineCacheCount = &local_34;
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_1_>
                  (pFVar1,fn);
        uVar3 = this->profiledCallSiteCount;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar3);
  }
  pvVar8 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
  if ((pvVar8 != (void *)0x0) && (uVar4 = GetCountField(this,InlineCacheCount), uVar4 != 0)) {
    uVar9 = 0;
    do {
      pFVar1 = *(FunctionCodeGenRuntimeData **)((long)pvVar8 + uVar9 * 8);
      Memory::Recycler::WBSetBit((char *)&local_50);
      local_50 = pFVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
      if (local_50 != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = &local_34;
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_2_>
                  (local_50,fn_00);
      }
      uVar9 = uVar9 + 1;
      uVar4 = GetCountField(this,InlineCacheCount);
    } while (uVar9 < uVar4);
  }
  if (local_34 != 0) {
    ThreadContext::NotifyInlineCacheBatchUnregistered
              (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               threadContext,local_34);
  }
  while (pvVar8 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead),
        pvVar8 != (void *)0x0) {
    this_03 = (FunctionBodyPolymorphicInlineCache *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead);
    FunctionBodyPolymorphicInlineCache::Finalize(this_03,false);
  }
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }